

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O3

int gpioWaveChain(char *buf,uint bufSize)

{
  ulong uVar1;
  undefined4 *puVar2;
  dmaOPage_t *pdVar3;
  long lVar4;
  dmaOPage_t **ppdVar5;
  uint32_t *dmaAddr;
  dmaOPage_t **ppdVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint32_t uVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioWaveChain_cold_1();
  }
  if (libInitialised == '\0') {
    iVar11 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioWaveChain_cold_2();
    }
  }
  else {
    if (waveClockInited == '\0') {
      stopHardwarePWM();
      initClock(0);
      waveClockInited = '\x01';
      PWMClockInited = 0;
    }
    dmaAddr = dmaOut;
    *dmaOut = 0x80000000;
    dmaAddr[1] = 0;
    ppdVar5 = dmaOVirt;
    waveEndPtr = (uint32_t *)0x0;
    pdVar3 = *dmaOVirt;
    iVar11 = 0x203004;
    if (gpioCfg.clockPeriph == 1) {
      iVar11 = 0x20c018;
    }
    uVar19 = 0x4020048;
    if (gpioCfg.clockPeriph == 1) {
      uVar19 = 0x4050048;
    }
    uVar12 = iVar11 + pi_peri_phys;
    pdVar3->cb[0x1a].info = uVar19;
    pdVar3->cb[0x1a].dst = uVar12 & 0xffffff | 0x7e000000;
    ppdVar6 = dmaOBus;
    iVar11 = (int)*dmaOBus;
    uVar19 = iVar11 + 0xffc;
    pdVar3->cb[0x1a].src = uVar19;
    pdVar3->cb[0x1a].length = 0x50;
    pdVar3->cb[0x1a].next = iVar11 + 0x360;
    iVar7 = waveOutCount;
    if (bufSize == 0) {
      uVar12 = 1;
    }
    else {
      iVar15 = 0x1c;
      uVar10 = 2;
      iVar23 = 0xac4;
      uVar18 = 1;
      iVar22 = 0x1b;
      uVar17 = 0;
      do {
        iVar8 = (int)buf[uVar17];
        if ((iVar7 <= iVar8) || (waveInfo[iVar8].deleted != 0)) {
          if ((gpioCfg.internals >> 10 & 1) != 0) {
            return -0x42;
          }
          gpioWaveChain_cold_3();
          return -0x42;
        }
        iVar16 = (int)uVar17;
        if (iVar16 == 0x256) {
          if ((gpioCfg.internals >> 10 & 1) != 0) {
            return -0x77;
          }
          gpioWaveChain_cold_5();
          return -0x77;
        }
        iVar9 = (int)((uVar10 & 0xffffffff) / 0x3c) * 0x3a;
        iVar13 = (int)(uVar18 / 0x3c);
        uVar1 = uVar17 + 1;
        lVar4 = *(long *)((long)ppdVar5 +
                         (ulong)((uint)((ulong)(uint)(iVar13 * 0x3a + 0x1b + iVar16) * 0x22b63cbf >>
                                       0x21) & 0xfffffff8));
        uVar21 = (ulong)((uint)((uVar1 & 0xffffffff) * 0x88888889 >> 0x22) & 0xfffffff8);
        *(uint *)((uVar18 / 0x3c) * -0xf0 + 0xac4 + *(long *)((long)ppdVar5 + uVar21) + uVar17 * 4)
             = (iVar9 + ((uint)(iVar15 + iVar9) / 0x76) * -0x76 + 0x1c + iVar16) * 0x20 +
               *(int *)((long)ppdVar6 +
                       (ulong)((uint)((ulong)(uint)((int)(uVar10 / 0x3c) * 0x3a + 0x1c + iVar16) *
                                      0x22b63cbf >> 0x21) & 0xfffffff8));
        iVar9 = (int)((uVar18 & 0xffffffff) / 0x3c) * 0x3a;
        lVar20 = (ulong)(iVar9 + ((uint)(iVar22 + iVar9) / 0x76) * -0x76 + 0x1b + iVar16) * 0x20;
        *(undefined4 *)(lVar4 + lVar20) = 0x4000008;
        *(int *)(lVar4 + 4 + lVar20) = iVar23 + iVar13 * -0xf0 + *(int *)((long)ppdVar6 + uVar21);
        *(uint *)(lVar4 + 8 + lVar20) =
             ((uint)waveInfo[iVar8].topCB % 0x76) * 0x20 +
             *(int *)(ppdVar6 + waveInfo[iVar8].topCB / 0x76) + 0x14;
        *(undefined4 *)(lVar4 + 0xc + lVar20) = 4;
        uVar12 = waveInfo[iVar8].botCB + 1;
        *(uint *)(lVar4 + 0x14 + lVar20) =
             ((uint)waveInfo[iVar8].botCB + (uVar12 / 0x76) * -0x76 + 1) * 0x20 +
             *(int *)(ppdVar6 + (ulong)uVar12 / 0x76);
        uVar18 = uVar18 + 1;
        uVar10 = uVar10 + 1;
        iVar15 = iVar15 + 1;
        iVar23 = iVar23 + 4;
        iVar22 = iVar22 + 1;
        uVar17 = uVar1;
      } while (bufSize != uVar1);
      if (0x256 < (uint)uVar1) {
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return -0x77;
        }
        gpioWaveChain_cold_4();
        return -0x77;
      }
      uVar12 = iVar16 + 2;
    }
    uVar12 = uVar12 + ((uVar12 & 0xffff) / 0x3c) * 0x3a + 0x1a;
    uVar14 = (uVar12 & 0xffff) / 0x76;
    puVar2 = (undefined4 *)
             ((long)ppdVar5[uVar14]->cb[0].pad +
             ((ulong)((uVar12 + uVar14 * -0x76 & 0xffff) << 5) - 0x18));
    *puVar2 = 0x4000008;
    puVar2[1] = uVar19;
    puVar2[2] = uVar19;
    puVar2[3] = 4;
    puVar2[5] = 0;
    initDMAgo(dmaAddr,iVar11 + 0x340);
    iVar11 = 0;
    waveEndPtr = puVar2 + 5;
  }
  return iVar11;
}

Assistant:

int gpioWaveChain(char *buf, unsigned bufSize)
{
   unsigned blklen=16, blocks=4;
   int cb, chaincb;
   rawCbs_t *p;
   int i, wid, cmd, loop, counters;
   unsigned cycles, delayCBs, dcb, delayLeft;
   uint32_t repeat, next, *endPtr;
   int stk_pos[10], stk_lev=0;

   cb = 0;
   loop = -1;

   DBG(DBG_USER, "bufSize=%d [%s]", bufSize, myBuf2Str(bufSize, buf));

   CHECK_INITED;

   if (!waveClockInited)
   {
      stopHardwarePWM();
      initClock(0); /* initialise secondary clock */
      waveClockInited = 1;
      PWMClockInited = 0;
   }

   dmaOut[DMA_CS] = DMA_CHANNEL_RESET;
   dmaOut[DMA_CONBLK_AD] = 0;
   waveEndPtr = NULL;
   endPtr = NULL;

   /* add delay cb at start of DMA */

   p = rawWaveCBAdr(chainGetCB(cb++));

   /* use the secondary clock */

   if (gpioCfg.clockPeriph != PI_CLOCK_PCM)
   {
      p->info = NORMAL_DMA | TIMED_DMA(2);
      p->dst  = PCM_TIMER;
   }
   else
   {
      p->info = NORMAL_DMA | TIMED_DMA(5);
      p->dst  = PWM_TIMER;
   }

   p->src    = (uint32_t) (&dmaOBus[0]->periphData);
   p->length = BPD * 20 / PI_WF_MICROS; /* 20 micros delay */
   p->next   = waveCbPOadr(chainGetCB(cb));

   counters = 0;
   wid = -1;

   i = 0;

   while (i<bufSize)
   {
      wid = (unsigned)buf[i];

      if (wid == 255) /* wave command */
      {
         if ((i+2) > bufSize)
            SOFT_ERROR(PI_BAD_CHAIN_CMD,
               "incomplete chain command (at %d)", i);

         cmd = buf[i+1];

         if (cmd == 0) /* loop begin */
         {
            if (stk_lev >= (sizeof(stk_pos)/sizeof(int)))
               SOFT_ERROR(PI_CHAIN_NESTING,
                  "chain counters nested too deep (at %d)", i);

            stk_pos[stk_lev++] = cb;

            i += 2;
         }
         else if (cmd == 1) /* loop end */
         {
            if (counters >= WCB_COUNTERS)
               SOFT_ERROR(PI_CHAIN_COUNTER,
                  "too many chain counters (at %d)", i);

            if ((i+4) > bufSize)
               SOFT_ERROR(PI_BAD_CHAIN_CMD,
                  "incomplete chain command (at %d)", i);

            loop = 0;
            if (--stk_lev >= 0) loop = stk_pos[stk_lev];

            if ((loop < 1) || (loop == cb))
               SOFT_ERROR(PI_BAD_CHAIN_LOOP,
                  "empty chain loop (at %d)", i);

            cycles = ((unsigned)buf[i+3] <<  8) + (unsigned)buf[i+2];

            i += 4;

            if (cycles > PI_MAX_WAVE_CYCLES)
               SOFT_ERROR(PI_CHAIN_LOOP_CNT,
                  "bad chain loop count (%d)", cycles);

            if (cycles == 0)
            {
               /* Skip the complete loop block.  Change
                  the next pointing to the start of the
                  loop block to the current cb.
               */
               p = rawWaveCBAdr(chainGetCB(loop));
               p->next = waveCbPOadr(chainGetCB(cb));
            }
            else if (cycles == 1)
            {
               /* Nothing to do, no need for a counter. */
            }
            else
            {
               chaincb = chainGetCB(cb++);
               if (chaincb < 0)
                  SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

               p = rawWaveCBAdr(chaincb);

               repeat = waveCbPOadr(chainGetCB(loop));

                /* Need to check next cb as well. */

               chaincb = chainGetCB(cb);

               if (chaincb < 0)
                  SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

               next = waveCbPOadr(chainGetCB(cb));

               /* dummy src and dest */
               p->info = NORMAL_DMA;
               p->src = (uint32_t) (&dmaOBus[0]->periphData);
               p->dst = (uint32_t) (&dmaOBus[0]->periphData);
               p->length = 4;
               p->next = waveCbPOadr(chainGetCntCB(counters));

               chainMakeCounter(counters, blklen, blocks,
                            cycles-1, repeat, next);

               counters++;
            }
         }
         else if (cmd == 2) /* delay us */
         {
            if ((i+4) > bufSize)
               SOFT_ERROR(PI_BAD_CHAIN_CMD,
                  "incomplete chain command (at %d)", i);

            cycles = ((unsigned)buf[i+3] <<  8) + (unsigned)buf[i+2];

            i += 4;

            if (cycles > PI_MAX_WAVE_DELAY)
               SOFT_ERROR(PI_BAD_CHAIN_DELAY,
                  "bad chain delay micros (%d)", cycles);

            if (cycles)
            {
               delayLeft = cycles;
               delayCBs = waveDelayCBs(delayLeft);
               for (dcb=0; dcb<delayCBs; dcb++)
               {
                  chaincb = chainGetCB(cb++);

                  if (chaincb < 0)
                     SOFT_ERROR(
                        PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

                  p = rawWaveCBAdr(chaincb);

                  /* use the secondary clock */

                  if (gpioCfg.clockPeriph != PI_CLOCK_PCM)
                  {
                     p->info = NORMAL_DMA | TIMED_DMA(2);
                     p->dst  = PCM_TIMER;
                  }
                  else
                  {
                     p->info = NORMAL_DMA | TIMED_DMA(5);
                     p->dst  = PWM_TIMER;
                  }

                  p->src = (uint32_t) (&dmaOBus[0]->periphData);

                  p->length = BPD * delayLeft / PI_WF_MICROS;

                  if ((gpioCfg.DMAsecondaryChannel >= DMA_LITE_FIRST) &&
                      (p->length > DMA_LITE_MAX))
                  {
                     p->length = DMA_LITE_MAX;
                  }

                  delayLeft -= (p->length / BPD);

                  p->next = waveCbPOadr(chainGetCB(cb));
               }
            }
         }
         else if (cmd == 3) /* repeat loop forever */
         {
            i += 2;

            loop = 0;
            if (--stk_lev >= 0) loop = stk_pos[stk_lev];

            if ((loop < 1) || (loop == cb))
               SOFT_ERROR(PI_BAD_CHAIN_LOOP,
                  "empty chain loop (at %d)", i);

            chaincb = chainGetCB(cb++);
            if (chaincb < 0)
               SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

            if (i < bufSize)
               SOFT_ERROR(PI_BAD_FOREVER,
                  "loop forever must be last command");

            p = rawWaveCBAdr(chaincb);

            /* dummy src and dest */
            p->info = NORMAL_DMA;
            p->src = (uint32_t) (&dmaOBus[0]->periphData);
            p->dst = (uint32_t) (&dmaOBus[0]->periphData);
            p->length = 4;
            p->next = waveCbPOadr(chainGetCB(loop));
            endPtr = &p->next;
         }
         else
            SOFT_ERROR(PI_BAD_CHAIN_CMD,
               "unknown chain command (255 %d)", cmd);
      }
      else if ((wid >= waveOutCount) || waveInfo[wid].deleted)
         SOFT_ERROR(PI_BAD_WAVE_ID, "undefined wave (%d)", wid);
      else
      {
         chaincb = chainGetCB(cb++);

         if (chaincb < 0)
            SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

         p = rawWaveCBAdr(chaincb);

         chaincb = chainGetCB(cb);

         if (chaincb < 0)
            SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

         chainSetVal(cb-1, waveCbPOadr(chaincb));

         /* patch next of wid topCB to next cb */

         p->info   = NORMAL_DMA;
         p->src    = chainGetValPadr(cb-1); /* this next */
         p->dst    = waveCbPOadr(waveInfo[wid].topCB) + 20; /* wid next */
         p->length = 4;
         p->next   = waveCbPOadr(waveInfo[wid].botCB+1);

         i += 1;
      }
   }

   chaincb = chainGetCB(cb++);

   if (chaincb < 0)
      SOFT_ERROR(PI_CHAIN_TOO_BIG, "chain is too long (%d)", cb);

   p = rawWaveCBAdr(chaincb);

   p->info   = NORMAL_DMA;
   p->src    = (uint32_t) (&dmaOBus[0]->periphData);
   p->dst    = (uint32_t) (&dmaOBus[0]->periphData);
   p->length = 4;
   p->next = 0;

   if (!endPtr) endPtr = &p->next;

   initDMAgo((uint32_t *)dmaOut, waveCbPOadr(chainGetCB(0)));

   waveEndPtr = endPtr;

   return 0;
}